

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausCollectLatchClauses(Clu_Man_t *p,Fra_Sml_t *pSeq)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj2;
  int *piVar5;
  Aig_Man_t *pAVar6;
  int iVar7;
  int i;
  Vec_Int_t *p_00;
  uint uVar8;
  
  iVar7 = p->nSimWords;
  pSeq->nWordsPref = p->nSimWordsPref;
  pAVar6 = p->pAig;
  iVar7 = iVar7 << 5;
  uVar8 = 0;
  uVar3 = 0;
  for (i = pAVar6->nObjs[2] - pAVar6->nRegs; i < pAVar6->vCis->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,i);
    iVar1 = Fra_ClausSmlNodeIsConst(pSeq,pObj);
    if (iVar1 == 0) {
      pAVar6 = p->pAig;
      for (iVar1 = pAVar6->nObjs[2] - pAVar6->nRegs; iVar1 < pAVar6->vCis->nSize; iVar1 = iVar1 + 1)
      {
        pObj2 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCis,iVar1);
        iVar4 = pObj2->Id;
        iVar2 = Fra_ClausSmlNodesAreImp(pSeq,pObj,pObj2);
        if (iVar2 == 0) {
          iVar2 = Fra_ClausSmlNodesAreImp(pSeq,pObj2,pObj);
          if (iVar2 != 0) {
            Vec_IntPush(p->vLits,p->pCnf->pVarNums[iVar4] * 2 + 1);
            p_00 = p->vLits;
            piVar5 = p->pCnf->pVarNums;
            iVar4 = pObj->Id;
            goto LAB_00550340;
          }
          iVar4 = Fra_ClausSmlNodesAreImpC(pSeq,pObj,pObj2);
          if (iVar4 != 0) {
            Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj->Id] * 2 + 1);
            p_00 = p->vLits;
            iVar4 = p->pCnf->pVarNums[pObj2->Id] * 2 + 1;
            goto LAB_00550345;
          }
        }
        else {
          Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj->Id] * 2 + 1);
          p_00 = p->vLits;
          piVar5 = p->pCnf->pVarNums;
          iVar4 = pObj2->Id;
LAB_00550340:
          iVar4 = piVar5[iVar4] * 2;
LAB_00550345:
          Vec_IntPush(p_00,iVar4);
          Vec_IntPush(p->vClauses,p->vLits->nSize);
          Vec_IntPush(p->vCosts,iVar7);
          uVar3 = uVar3 + 1;
        }
        pAVar6 = p->pAig;
      }
      if (p->nClausesMax / 2 < (int)(uVar3 + uVar8)) break;
    }
    else {
      Vec_IntPush(p->vLits,p->pCnf->pVarNums[pObj->Id] * 2 + 1);
      Vec_IntPush(p->vClauses,p->vLits->nSize);
      Vec_IntPush(p->vCosts,iVar7);
      uVar8 = uVar8 + 1;
      pAVar6 = p->pAig;
    }
  }
  pSeq->nWordsPref = 0;
  if (p->fVerbose != 0) {
    printf("Collected %d register constants and %d one-hotness implications.\n",(ulong)uVar8,
           (ulong)uVar3);
  }
  p->nOneHots = uVar3 + uVar8;
  p->nOneHotsProven = 0;
  return 0;
}

Assistant:

int Fra_ClausCollectLatchClauses( Clu_Man_t * p, Fra_Sml_t * pSeq )
{
    Aig_Obj_t * pObj1, * pObj2;
    unsigned * pSims1, * pSims2;
    int CostMax, i, k, nCountConst, nCountImps;

    nCountConst = nCountImps = 0;
    CostMax = p->nSimWords * 32;
/*
    // add the property
    {
        Aig_Obj_t * pObj;
        int Lits[1];
        pObj = Aig_ManCo( p->pAig, 0 );
        Lits[0] = toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        Vec_IntPush( p->vLits, Lits[0] );
        Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
        Vec_IntPush( p->vCosts, CostMax );
        nCountConst++;
//        printf( "Added the target property to the set of clauses to be inductively checked.\n" );
    }
*/

    pSeq->nWordsPref = p->nSimWordsPref;
    Aig_ManForEachLoSeq( p->pAig, pObj1, i )
    {
        pSims1 = Fra_ObjSim( pSeq, pObj1->Id );
        if ( Fra_ClausSmlNodeIsConst( pSeq, pObj1 ) )
        {
            Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
            Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
            Vec_IntPush( p->vCosts, CostMax );
            nCountConst++;
            continue;
        }
        Aig_ManForEachLoSeq( p->pAig, pObj2, k )
        {
            pSims2 = Fra_ObjSim( pSeq, pObj2->Id );
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImp( pSeq, pObj2, pObj1 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 0 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
            if ( Fra_ClausSmlNodesAreImpC( pSeq, pObj1, pObj2 ) )
            {
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj1->Id], 1 ) );
                Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pObj2->Id], 1 ) );
                Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
                Vec_IntPush( p->vCosts, CostMax );
                nCountImps++;
                continue;
            }
        }
        if ( nCountConst + nCountImps > p->nClausesMax / 2 )
            break;
    }
    pSeq->nWordsPref = 0;
    if ( p->fVerbose )
    printf( "Collected %d register constants and %d one-hotness implications.\n", nCountConst, nCountImps );
    p->nOneHots = nCountConst + nCountImps;
    p->nOneHotsProven = 0;
    return 0;
}